

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O3

void sel_grow_repeat_new_proc(Am_Object *command_obj,Am_Value *new_sel,Am_Value *new_value)

{
  bool bVar1;
  unsigned_short uVar2;
  Am_Value *pAVar3;
  Am_Object parent;
  Am_Selective_Repeat_New_Method method;
  Am_Object local_60;
  Am_Object local_58;
  Am_Value_List local_50;
  Am_Value local_40;
  Am_Value local_30;
  
  bVar1 = Am_Value_List::Test(new_sel);
  if (bVar1) {
    Am_Value_List::Am_Value_List(&local_50,new_sel);
    uVar2 = Am_Value_List::Length(&local_50);
    if (uVar2 == 1) {
      Am_Value_List::Start(&local_50);
      pAVar3 = Am_Value_List::Get(&local_50);
      Am_Value::operator=(new_sel,pAVar3);
    }
    Am_Value_List::~Am_Value_List(&local_50);
  }
  Am_Object::Get_Object(&local_60,0xdd38,0xc6);
  pAVar3 = Am_Object::Get(&local_60,0x14a,0);
  Am_Selective_Repeat_New_Method::Am_Selective_Repeat_New_Method
            ((Am_Selective_Repeat_New_Method *)&local_50,pAVar3);
  Am_Object::~Am_Object(&local_60);
  Am_Object::Am_Object(&local_58,command_obj);
  Am_Value::Am_Value(&local_30,new_sel);
  Am_Value::Am_Value(&local_40,new_value);
  (*(code *)local_50.item)(&local_58,&local_30,&local_40);
  Am_Value::~Am_Value(&local_40);
  Am_Value::~Am_Value(&local_30);
  Am_Object::~Am_Object(&local_58);
  pAVar3 = Am_Object::Get(command_obj,0x154,0);
  Am_Object::Am_Object(&local_60,pAVar3);
  bVar1 = Am_Object::Valid(&local_60);
  if (bVar1) {
    pAVar3 = Am_Object::Get(command_obj,0x16d,0);
    Am_Object::Set(&local_60,0x16d,pAVar3,0);
    pAVar3 = Am_Object::Get(command_obj,0x169,0);
    Am_Object::Set(&local_60,0x169,pAVar3,0);
    pAVar3 = Am_Object::Get(command_obj,0x16c,0);
    Am_Object::Set(&local_60,0x16c,pAVar3,0);
    pAVar3 = Am_Object::Get(&local_60,0x154,0);
    Am_Object::operator=(&local_60,pAVar3);
    bVar1 = Am_Object::Valid(&local_60);
    if (bVar1) {
      pAVar3 = Am_Object::Get(command_obj,0x16d,0);
      Am_Object::Set(&local_60,0x16d,pAVar3,0);
      pAVar3 = Am_Object::Get(command_obj,0x169,0);
      Am_Object::Set(&local_60,0x169,pAVar3,0);
      pAVar3 = Am_Object::Get(command_obj,0x16c,0);
      Am_Object::Set(&local_60,0x16c,pAVar3,0);
    }
  }
  Am_Object::~Am_Object(&local_60);
  return;
}

Assistant:

Am_Define_Method(Am_Selective_Repeat_New_Method, void, sel_grow_repeat_new,
                 (Am_Object command_obj, Am_Value new_sel, Am_Value new_value))
{
  if (Am_Value_List::Test(new_sel)) {
    Am_Value_List l = new_sel;
    if (l.Length() == 1) {
      l.Start();
      new_sel = l.Get();
    }
  }
  //now call the regular grow again method
  Am_Selective_Repeat_New_Method method =
      Am_Move_Grow_Interactor.Get_Object(Am_IMPLEMENTATION_COMMAND)
          .Get(Am_SELECTIVE_REPEAT_ON_NEW_METHOD);
  method.Call(command_obj, new_sel, new_value);
  Am_Object parent = command_obj.Get(Am_IMPLEMENTATION_PARENT);
  //in selection widget, parent is interactor's main command, and parent's
  //parent is the move-grow command in the widget
  if (parent.Valid()) {
    parent.Set(Am_OBJECT_MODIFIED, command_obj.Get(Am_OBJECT_MODIFIED));
    parent.Set(Am_VALUE, command_obj.Get(Am_VALUE));
    parent.Set(Am_OLD_VALUE, command_obj.Get(Am_OLD_VALUE));
    parent = parent.Get(Am_IMPLEMENTATION_PARENT);
    if (parent.Valid()) {
      parent.Set(Am_OBJECT_MODIFIED, command_obj.Get(Am_OBJECT_MODIFIED));
      parent.Set(Am_VALUE, command_obj.Get(Am_VALUE));
      parent.Set(Am_OLD_VALUE, command_obj.Get(Am_OLD_VALUE));
    }
  }
}